

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

Ptr __thiscall core::image::load_tiff_file(image *this,string *filename)

{
  undefined8 uVar1;
  Exception *pEVar2;
  TypedImageBase<unsigned_char> *this_00;
  ImageData *this_01;
  reference pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar4;
  exception *e;
  tdata_t row_pointer;
  uint32 row;
  ImageData *data;
  uint32 rowstride;
  short local_64;
  ushort local_62;
  uint local_60;
  uint16 bits;
  uint16 channels;
  uint32 height;
  uint32 width;
  allocator local_41;
  string local_40 [32];
  long local_20;
  TIFF *tif;
  string *filename_local;
  Ptr *image;
  
  tif = (TIFF *)filename;
  filename_local = (string *)this;
  TIFFSetWarningHandler(0);
  TIFFSetErrorHandler(tiff_error_handler);
  uVar1 = std::__cxx11::string::c_str();
  local_20 = TIFFOpen(uVar1,"r");
  if (local_20 == 0) {
    height._3_1_ = 1;
    pEVar2 = (Exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"TIFF file format not recognized",&local_41);
    util::Exception::Exception(pEVar2,(string *)local_40);
    height._3_1_ = 0;
    __cxa_throw(pEVar2,&util::Exception::typeinfo,util::Exception::~Exception);
  }
  TIFFGetField(local_20,0x100,&bits);
  TIFFGetField(local_20,0x101,&local_60);
  TIFFGetField(local_20,0x115,&local_62);
  TIFFGetField(local_20,0x102,&local_64);
  if (local_64 == 8) {
    data._5_1_ = 0;
    Image<unsigned_char>::create((Image<unsigned_char> *)this,_bits,local_60,(uint)local_62);
    data._0_4_ = TIFFScanlineSize(local_20);
    this_00 = &std::
               __shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)this)->super_TypedImageBase<unsigned_char>;
    this_01 = TypedImageBase<unsigned_char>::get_data(this_00);
    for (row_pointer._4_4_ = 0; row_pointer._4_4_ < local_60;
        row_pointer._4_4_ = row_pointer._4_4_ + 1) {
      pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (this_01,(ulong)(row_pointer._4_4_ * (int)data));
      TIFFReadScanline(local_20,pvVar3,row_pointer._4_4_,0);
    }
    TIFFClose(local_20);
    PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = extraout_RDX._M_pi;
    PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (Ptr)PVar4.super___shared_ptr<core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>;
  }
  data._6_1_ = 1;
  pEVar2 = (Exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&rowstride,"Expected 8 bit TIFF file",(allocator *)((long)&data + 7));
  util::Exception::Exception(pEVar2,(string *)&rowstride);
  data._6_1_ = 0;
  __cxa_throw(pEVar2,&util::Exception::typeinfo,util::Exception::~Exception);
}

Assistant:

ByteImage::Ptr
load_tiff_file (std::string const& filename)
{
    TIFFSetWarningHandler(nullptr);
    TIFFSetErrorHandler(tiff_error_handler);

    TIFF* tif = TIFFOpen(filename.c_str(), "r");
    if (!tif)
        throw util::Exception("TIFF file format not recognized");

    try
    {
        /* Read width and height from TIFF and create MVE image. */
        uint32 width, height;
        uint16 channels, bits;
        TIFFGetField(tif, TIFFTAG_IMAGEWIDTH, &width);
        TIFFGetField(tif, TIFFTAG_IMAGELENGTH, &height);
        TIFFGetField(tif, TIFFTAG_SAMPLESPERPIXEL, &channels);
        TIFFGetField(tif, TIFFTAG_BITSPERSAMPLE, &bits);
        if (bits != 8)
            throw util::Exception("Expected 8 bit TIFF file");
        ByteImage::Ptr image = ByteImage::create(width, height, channels);

        /* Scanline based TIFF reading. */
        uint32 rowstride = TIFFScanlineSize(tif);
        ByteImage::ImageData& data = image->get_data();
        for (uint32 row = 0; row < height; row++)
        {
            tdata_t row_pointer = &data[row * rowstride];
            TIFFReadScanline(tif, row_pointer, row);
        }

        TIFFClose(tif);
        return image;
    }
    catch (std::exception& e)
    {
        TIFFClose(tif);
        throw;
    }
}